

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O1

unique_ptr<groundupdb::IQueryResult,_std::default_delete<groundupdb::IQueryResult>_> __thiscall
groundupdbext::EmbeddedDatabase::Impl::query(Impl *this,BucketQuery *query)

{
  _func_int **pp_Var1;
  long *plVar2;
  DefaultQueryResult *this_00;
  long *plVar3;
  long *in_RDX;
  string idxKey;
  Set local_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  HashedValue local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (**(code **)(*in_RDX + 0x10))(&local_78);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x1a43ed);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_88 = *plVar3;
    lStack_80 = plVar2[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar3;
    local_98 = (long *)*plVar2;
  }
  local_90 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((Bytes *)local_78._vptr_HashedValue != &local_78.m_data) {
    operator_delete(local_78._vptr_HashedValue,
                    (ulong)(local_78.m_data.
                            super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                            super__Vector_impl_data._M_start + 1));
  }
  pp_Var1 = query[5].super_Query._vptr_Query;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_40,local_98,local_90 + (long)local_98);
  groundupdb::HashedValue::HashedValue<std::__cxx11::string>(&local_78,&local_40);
  (**(code **)(*pp_Var1 + 0x28))(&local_a0,pp_Var1,&local_78);
  this_00 = (DefaultQueryResult *)operator_new(0x10);
  DefaultQueryResult::DefaultQueryResult(this_00,&local_a0);
  std::
  unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
  ::~unique_ptr(&local_a0);
  local_78._vptr_HashedValue = (_func_int **)&PTR__HashedValue_001d4818;
  if (local_78.m_data.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.m_data.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.m_data.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.m_data.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (this->super_IDatabase)._vptr_IDatabase = (_func_int **)this_00;
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  return (__uniq_ptr_data<groundupdb::IQueryResult,_std::default_delete<groundupdb::IQueryResult>,_true,_true>
          )(__uniq_ptr_data<groundupdb::IQueryResult,_std::default_delete<groundupdb::IQueryResult>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<IQueryResult>
EmbeddedDatabase::Impl::query(BucketQuery& query) const {
  // Bucket query
  // construct a name for our key index
  std::string idxKey("bucket::" + query.bucket());
  // query the key index

  //std::cout << "EDB::Impl:query fetching kv set for bucket with key: " << idxKey << std::endl;
  std::unique_ptr<IQueryResult> r = std::make_unique<DefaultQueryResult>(m_indexStore->getKeyValueSet(HashedKey(idxKey)));
  //std::cout << "EDB::Impl:query result size: " << r.get()->recordKeys()->size() << std::endl;
  return std::move(r);
}